

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdEmuD3D0Alpha::is_valid_val(MthdEmuD3D0Alpha *this)

{
  MthdEmuD3D0Alpha *this_local;
  
  if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x34) >> 0x3c == 0) ||
     (8 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x34) >> 0x3c)) {
    this_local._7_1_ = false;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x2c == 0) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 8, 4) < 1 || extr(val, 8, 4) > 8)
			return false;
		if (extr(val, 12, 20))
			return false;
		return true;
	}